

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPoolInline.h
# Opt level: O2

void * sbfPool_get(sbfPool pool)

{
  u_int *puVar1;
  sbfPoolItemImpl *psVar2;
  sbfPoolItemImpl *psVar3;
  
  LOCK();
  puVar1 = &pool->mCount->mGets;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  pthread_spin_lock(&pool->mLock);
  psVar2 = pool->mAvailable;
  if (psVar2 == (sbfPoolItemImpl *)0x0) {
    LOCK();
    psVar2 = pool->mFree;
    pool->mFree = (sbfPoolItemImpl *)0x0;
    UNLOCK();
    psVar3 = (sbfPoolItemImpl *)0x0;
    if (psVar2 == (sbfPoolItemImpl *)0x0) goto LAB_001051ca;
  }
  pool->mAvailable = psVar2->mNext;
  psVar3 = psVar2;
LAB_001051ca:
  pthread_spin_unlock(&pool->mLock);
  if (psVar3 == (sbfPoolItemImpl *)0x0) {
    LOCK();
    puVar1 = &pool->mCount->mNews;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
    psVar3 = (sbfPoolItemImpl *)sbfMemory_malloc(pool->mSize);
    psVar3->mPool = pool;
    psVar3->mNext = (sbfPoolItemImpl *)0x0;
  }
  return psVar3 + 1;
}

Assistant:

static SBF_INLINE void*
sbfPool_get (sbfPool pool)
{
    sbfPoolItem item;

#ifdef WIN32
    InterlockedIncrement (&pool->mCount->mGets);
#else
    __sync_fetch_and_add (&pool->mCount->mGets, 1);
#endif

    item = sbfPoolNextItem (pool);
    if (item == NULL)
        item = sbfPoolNew (pool);
    return item + 1;
}